

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O2

void __thiscall SQBlob::SQBlob(SQBlob *this,SQInteger size)

{
  uchar *__s;
  
  (this->super_SQStream)._vptr_SQStream = (_func_int **)&PTR__SQBlob_0010f4a0;
  this->_size = size;
  this->_allocated = size;
  __s = (uchar *)sq_malloc(size);
  this->_buf = __s;
  memset(__s,0,this->_size);
  this->_ptr = 0;
  this->_owns = true;
  return;
}

Assistant:

SQBlob(SQInteger size) {
        _size = size;
        _allocated = size;
        _buf = (unsigned char *)sq_malloc(size);
        memset(_buf, 0, _size);
        _ptr = 0;
        _owns = true;
    }